

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
pstore::command_line::parser_base::add_literal_option
          (parser_base *this,string *name,int value,string *description)

{
  literal local_58;
  
  literal::literal(&local_58,name,value,description);
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
  emplace_back<pstore::command_line::literal>(&this->literals_,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.description._M_dataplus._M_p != &local_58.description.field_2) {
    operator_delete(local_58.description._M_dataplus._M_p,
                    local_58.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != &local_58.name.field_2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void parser_base::add_literal_option (std::string const & name, int const value,
                                                  std::string const & description) {
                literals_.emplace_back (literal{name, value, description});
            }